

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O0

void __thiscall dlib::drawable_window::paint(drawable_window *this,canvas *c)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  map_pair<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>_>
  *pmVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  long *plVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 *puVar7;
  canvas *in_RSI;
  long in_RDI;
  binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
  *in_stack_00000008;
  binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
  *in_stack_00000200;
  
  *(long *)(in_RDI + 0x548) = *(long *)(in_RDI + 0x548) + 1;
  canvas::fill(in_RSI,*(uchar *)(in_RDI + 0x48),*(uchar *)(in_RDI + 0x49),*(uchar *)(in_RDI + 0x4a))
  ;
  binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
  ::reset((binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
           *)(in_RDI + 0x50));
  while (bVar2 = binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
                 ::move_next(in_stack_00000008), bVar2) {
    pmVar4 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
             ::element(in_stack_00000200);
    iVar3 = (*pmVar4->_vptr_map_pair[4])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))();
    while( true ) {
      pmVar4 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
               ::element(in_stack_00000200);
      iVar3 = (*pmVar4->_vptr_map_pair[4])();
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x38))();
      if ((uVar5 & 1) == 0) break;
      pmVar4 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
               ::element(in_stack_00000200);
      iVar3 = (*pmVar4->_vptr_map_pair[4])();
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x30))();
      if ((*(byte *)(*plVar6 + 0x38) & 1) == 0) {
        pmVar4 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
                 ::element(in_stack_00000200);
        iVar3 = (*pmVar4->_vptr_map_pair[4])();
        plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x30))();
        if (*(long *)(*plVar6 + 0x78) != *(long *)(in_RDI + 0x548)) {
          uVar1 = *(undefined8 *)(in_RDI + 0x548);
          pmVar4 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
                   ::element(in_stack_00000200);
          iVar3 = (*pmVar4->_vptr_map_pair[4])();
          plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x30))();
          *(undefined8 *)(*plVar6 + 0x78) = uVar1;
          pmVar4 = binary_search_tree_kernel_c<dlib::binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>_>
                   ::element(in_stack_00000200);
          iVar3 = (*pmVar4->_vptr_map_pair[4])();
          puVar7 = (undefined8 *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x30))();
          (**(code **)(*(long *)*puVar7 + 0x50))((long *)*puVar7,in_RSI);
        }
      }
    }
  }
  return;
}

Assistant:

void drawable_window::
    paint (
        const canvas& c
    )
    {
        ++event_id;
        c.fill(bg_color.red,bg_color.green,bg_color.blue);

        widgets.reset();
        while (widgets.move_next())
        {
            widgets.element().value().reset();
            while (widgets.element().value().move_next())
            {
                // only dispatch a draw() call if this widget isn't hidden
                if (widgets.element().value().element()->hidden == false &&
                    widgets.element().value().element()->event_id != event_id)
                {
                    widgets.element().value().element()->event_id = event_id;
                    widgets.element().value().element()->draw(c);
                }
            }
        }
    }